

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_7c237::getRandTRS(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float *pfVar1;
  Vec3<float> *in_RCX;
  Vec3<float> *in_RDX;
  Vec3<float> *in_RSI;
  float a;
  float b;
  float a_00;
  float b_00;
  float fVar2;
  float b_01;
  double dVar3;
  int j;
  V3f s;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  Vec3<float> local_44;
  Vec3<float> local_38;
  Vec3<float> local_2c;
  Vec3<float> *local_20;
  Vec3<float> *local_18;
  Vec3<float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  a = (float)dVar3;
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (double)CONCAT44(a,in_stack_ffffffffffffffa0));
  b = (float)dVar3;
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (double)CONCAT44(a,b));
  Imath_3_2::Vec3<float>::Vec3(&local_2c,a,b,(float)dVar3);
  Imath_3_2::Vec3<float>::operator=(local_10,&local_2c);
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (double)CONCAT44(a,b));
  a_00 = rad((float)dVar3);
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(a_00,in_stack_ffffffffffffffa8),(double)CONCAT44(a,b));
  b_00 = rad((float)dVar3);
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(a_00,b_00),(double)CONCAT44(a,b));
  fVar2 = rad((float)dVar3);
  Imath_3_2::Vec3<float>::Vec3(&local_38,a_00,b_00,fVar2);
  Imath_3_2::Vec3<float>::operator=(local_18,&local_38);
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (double)CONCAT44(a_00,b_00),(double)CONCAT44(a,b));
  fVar2 = (float)dVar3;
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(fVar2,in_stack_ffffffffffffffb0),(double)CONCAT44(a_00,b_00)
                     ,(double)CONCAT44(a,b));
  b_01 = (float)dVar3;
  dVar3 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)CONCAT44(fVar2,b_01),(double)CONCAT44(a_00,b_00),
                     (double)CONCAT44(a,b));
  Imath_3_2::Vec3<float>::Vec3(&local_44,fVar2,b_01,(float)dVar3);
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(fVar2,b_01),(double)CONCAT44(a_00,b_00),
                       (double)CONCAT44(a,b));
    if (0.5 <= dVar3) {
      pfVar1 = Imath_3_2::Vec3<float>::operator[](&local_44,local_48);
      *pfVar1 = *pfVar1 * -1.0;
    }
  }
  Imath_3_2::Vec3<float>::operator=(local_20,&local_44);
  return;
}

Assistant:

void
getRandTRS (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    // Translate
    trans = V3f (
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)));
    // Rotate
    rot = V3f (
        rad (float(random.nextf (-180, 180))),
        rad (float(random.nextf (-180, 180))),
        rad (float(random.nextf (-180, 180))));

    // Scale
    V3f s (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));
    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) s[j] *= -1;
    scale = s;
}